

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_test.cpp
# Opt level: O3

void __thiscall
PermutationElement_UniformDelta_Test::~PermutationElement_UniformDelta_Test
          (PermutationElement_UniformDelta_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(PermutationElement, UniformDelta) {
    for (int n : { 2, 3, 4, 5, 9, 14, 16, 22, 27, 36 }) {
        std::vector<int> count(n * n);

        int numIters = 60000 * n;
        for (int seed = 0; seed < numIters; ++seed) {
            for (int i = 0; i < n; ++i) {
                int ip = PermutationElement(i, n, MixBits(seed));
                int delta = ip - i;
                if (delta < 0) delta += n;
                CHECK_LT(delta, n);
                int offset = delta * n + i;
                ++count[offset];
            }
        }

        for (int i = 0; i < n; ++i) {
            for (int j = 0; j < n; ++j) {
                Float tol = 0.03f;
                int offset = j * n + i;
                EXPECT_TRUE(count[offset] >= (1 - tol) * numIters / n &&
                            count[offset] <=(1 + tol) * numIters / n) <<
                StringPrintf("Got count %d for %d -> %d (perm size %d). Expected +/- %d.\n",
                                 count[offset], i, j, n, numIters / n);
            }
        }
    }
}